

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexpander.cpp
# Opt level: O1

FString BuildPath(FString *base,char *name)

{
  char *in_RDX;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  base->Chars = (char *)0x727dbc;
  if (*(int *)(*(long *)name + -0xc) != 0) {
    FString::operator=(base,(FString *)name);
    if (base->Chars[(ulong)*(uint *)(base->Chars + -0xc) - 1] != '/') {
      FString::operator+=(base,'/');
    }
  }
  FString::operator+=(base,in_RDX);
  return (FString)(char *)base;
}

Assistant:

static FString BuildPath(const FString &base, const char *name)
{
	FString current;
	if (base.IsNotEmpty())
	{
		current = base;
		if (current[current.Len() - 1] != '/') current += '/';
	}
	current += name;
	return current;
}